

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

bool __thiscall
cmTarget::PushTLLCommandTrace(cmTarget *this,TLLSignature signature,cmListFileContext *lfc)

{
  pointer ppVar1;
  bool bVar2;
  bool bVar3;
  TLLSignature local_74;
  pair<cmTarget::TLLSignature,_cmListFileContext> local_70;
  
  ppVar1 = (this->TLLCommands).
           super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_74 = signature;
  if ((this->TLLCommands).
      super__Vector_base<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
      ._M_impl.super__Vector_impl_data._M_start == ppVar1) {
    bVar3 = true;
  }
  else {
    bVar3 = ppVar1[-1].first == signature;
    bVar2 = operator!=(&ppVar1[-1].second,lfc);
    if (!bVar2) {
      return bVar3;
    }
  }
  std::pair<cmTarget::TLLSignature,_cmListFileContext>::pair<cmTarget::TLLSignature_&,_true>
            (&local_70,&local_74,lfc);
  std::
  vector<std::pair<cmTarget::TLLSignature,cmListFileContext>,std::allocator<std::pair<cmTarget::TLLSignature,cmListFileContext>>>
  ::emplace_back<std::pair<cmTarget::TLLSignature,cmListFileContext>>
            ((vector<std::pair<cmTarget::TLLSignature,cmListFileContext>,std::allocator<std::pair<cmTarget::TLLSignature,cmListFileContext>>>
              *)&this->TLLCommands,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.second.FilePath._M_dataplus._M_p != &local_70.second.FilePath.field_2) {
    operator_delete(local_70.second.FilePath._M_dataplus._M_p,
                    local_70.second.FilePath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.second.Name._M_dataplus._M_p != &local_70.second.Name.field_2) {
    operator_delete(local_70.second.Name._M_dataplus._M_p,
                    local_70.second.Name.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool cmTarget::PushTLLCommandTrace(TLLSignature signature,
                                   cmListFileContext const& lfc)
{
  bool ret = true;
  if (!this->TLLCommands.empty())
    {
    if (this->TLLCommands.back().first != signature)
      {
      ret = false;
      }
    }
  if (this->TLLCommands.empty() || this->TLLCommands.back().second != lfc)
    {
    this->TLLCommands.push_back(std::make_pair(signature, lfc));
    }
  return ret;
}